

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::emitUrlSelected(QFileDialogPrivate *this,QUrl *file)

{
  long lVar1;
  QFileDialog *this_00;
  ulong uVar2;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *q;
  QString *in_stack_ffffffffffffffb8;
  QFileDialog *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  QFileDialog::urlSelected(in_stack_ffffffffffffffc0,(QUrl *)in_stack_ffffffffffffffb8);
  uVar2 = QUrl::isLocalFile();
  if ((uVar2 & 1) != 0) {
    QUrl::toLocalFile();
    QFileDialog::fileSelected(this_00,in_stack_ffffffffffffffb8);
    QString::~QString((QString *)0x750920);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::emitUrlSelected(const QUrl &file)
{
    Q_Q(QFileDialog);
    emit q->urlSelected(file);
    if (file.isLocalFile())
        emit q->fileSelected(file.toLocalFile());
}